

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::WriteLegacyOutput
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int summary_id,int type,
          int ensemble_id,double retperiod,OASIS_FLOAT loss)

{
  int iVar1;
  int iVar2;
  char buffer [4096];
  char acStack_1028 [4104];
  
  iVar1 = snprintf(acStack_1028,0x1000,"%d,%d,%f,%f",retperiod,(double)loss,summary_id,
                   (ulong)(uint)type);
  if ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    iVar2 = snprintf(acStack_1028 + iVar1,(long)(0x1000 - iVar1),",%d",ensemble_id);
    iVar1 = iVar1 + iVar2;
  }
  iVar2 = snprintf(acStack_1028 + iVar1,(long)(0x1000 - iVar1),"\n");
  OutputRows(this,fileIDs,acStack_1028,iVar1 + iVar2);
  return;
}

Assistant:

void aggreports::WriteLegacyOutput(const std::vector<int> &fileIDs,
				   const int summary_id, const int type,
				   const int ensemble_id,
				   const double retperiod,
				   const OASIS_FLOAT loss) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;
  strLen = snprintf(buffer, bufferSize, "%d,%d,%f,%f", summary_id, type,
		    retperiod, loss);
  if (ensembletosidx_.size() > 0) {
    strLen += snprintf(buffer+strLen, bufferSize-strLen, ",%d", ensemble_id);
  }
  strLen += snprintf(buffer+strLen, bufferSize-strLen, "\n");
  OutputRows(fileIDs, buffer, strLen);

}